

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

bool __thiscall QHostInfoLookupManager::wasAborted(QHostInfoLookupManager *this,int id)

{
  bool bVar1;
  long in_FS_OFFSET;
  int local_2c;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &this->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_2c = id;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  bVar1 = true;
  if (this->wasDeleted == false) {
    bVar1 = QListSpecialMethodsBase<int>::contains<int>
                      ((QListSpecialMethodsBase<int> *)&this->abortedLookups,&local_2c);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHostInfoLookupManager::wasAborted(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return true;

    return abortedLookups.contains(id);
}